

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinDynamics.cpp
# Opt level: O2

void __thiscall OpenMD::LangevinDynamics::moveA(LangevinDynamics *this)

{
  RotationAlgorithm *pRVar1;
  Molecule *pMVar2;
  pointer ppSVar3;
  StuntDouble *this_00;
  MoleculeIterator i;
  Vector3d pos;
  Vector3d ji;
  Vector3d Tb;
  Vector3d frc;
  Vector3d vel;
  MoleculeIterator local_e0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector3d local_60;
  Vector<double,_3U> local_48;
  
  local_e0._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_d8);
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_c0);
  pMVar2 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_e0);
  while (pMVar2 != (Molecule *)0x0) {
    ppSVar3 = (pMVar2->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar3 !=
        (pMVar2->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0018c45c;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_48,this_00);
      Vector<double,_3U>::operator=(&local_78,&local_48);
      StuntDouble::getPos((Vector3d *)&local_48,this_00);
      Vector<double,_3U>::operator=(&local_d8,&local_48);
      StuntDouble::getFrc((Vector3d *)&local_48,this_00);
      Vector<double,_3U>::operator=(&local_90,&local_48);
      operator*(&local_48,
                ((this->super_VelocityVerletIntegrator).super_Integrator.dt2 / this_00->mass_) *
                0.0004184,&local_90);
      Vector<double,_3U>::add(&local_78,&local_48);
      operator*(&local_48,(this->super_VelocityVerletIntegrator).super_Integrator.dt,&local_78);
      Vector<double,_3U>::add(&local_d8,&local_48);
      StuntDouble::setVel(this_00,(Vector3d *)&local_78);
      StuntDouble::setPos(this_00,(Vector3d *)&local_d8);
      if (this_00->objType_ - otDAtom < 2) {
        StuntDouble::getTrq(&local_60,this_00);
        StuntDouble::lab2Body((Vector3d *)&local_48,this_00,&local_60);
        Vector<double,_3U>::operator=(&local_a8,&local_48);
        StuntDouble::getJ((Vector3d *)&local_48,this_00);
        Vector<double,_3U>::operator=(&local_c0,&local_48);
        operator*(&local_48,(this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184,
                  &local_a8);
        Vector<double,_3U>::add(&local_c0,&local_48);
        pRVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.rotAlgo_;
        (*pRVar1->_vptr_RotationAlgorithm[2])
                  ((this->super_VelocityVerletIntegrator).super_Integrator.dt,pRVar1,this_00,
                   &local_c0);
        StuntDouble::setJ(this_00,(Vector3d *)&local_c0);
      }
      ppSVar3 = ppSVar3 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar3 !=
          (pMVar2->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0018c45c:
        this_00 = *ppSVar3;
      }
    }
    pMVar2 = SimInfo::nextMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_e0);
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  Rattle::constraintA((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
  return;
}

Assistant:

void LangevinDynamics::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel  = sd->getVel();
        pos  = sd->getPos();
        frc  = sd->getFrc();
        mass = sd->getMass();

        // velocity half step
        vel += (dt2 / mass * Constants::energyConvert) * frc;

        // position whole step
        pos += dt * vel;

        sd->setVel(vel);
        sd->setPos(pos);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += (dt2 * Constants::energyConvert) * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }  // end for(mol = info_->beginMolecule(i))

    flucQ_->moveA();
    rattle_->constraintA();
  }